

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall
FormatterTest_UnmatchedBraces_Test::TestBody(FormatterTest_UnmatchedBraces_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b0;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format string",(allocator *)&local_b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[2]>(&local_38,(char (*) [2])0x1e5083);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [93])
               "Expected: format(\"{\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f1,pcVar2);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"unmatched \'}\' in format string",
               (allocator *)&local_b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[2]>(&local_58,(char (*) [2])0x1fab02);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [93])
               "Expected: format(\"}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f2,pcVar2);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format string",(allocator *)&local_b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[5]>(&local_78,(char (*) [5])"{0{}");
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [96])
               "Expected: format(\"{0{}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f3,pcVar2);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, UnmatchedBraces) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("}"), format_error, "unmatched '}' in format string");
  EXPECT_THROW_MSG(format("{0{}"), format_error, "invalid format string");
}